

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cc
# Opt level: O0

void __thiscall
phosg::expectation_failed::expectation_failed
          (expectation_failed *this,char *msg,char *file,uint64_t line)

{
  string local_48;
  uint64_t local_28;
  uint64_t line_local;
  char *file_local;
  char *msg_local;
  expectation_failed *this_local;
  
  local_28 = line;
  line_local = (uint64_t)file;
  file_local = msg;
  msg_local = (char *)this;
  string_printf_abi_cxx11_(&local_48,"failure at %s:%lu: %s",file,line,msg);
  ::std::logic_error::logic_error(&this->super_logic_error,(string *)&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)this = &PTR__expectation_failed_00182d00;
  this->msg = file_local;
  this->file = (char *)line_local;
  this->line = local_28;
  return;
}

Assistant:

expectation_failed::expectation_failed(const char* msg, const char* file, uint64_t line)
    : logic_error(string_printf("failure at %s:%" PRIu64 ": %s", file, line, msg)),
      msg(msg),
      file(file),
      line(line) {}